

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  cmGeneratorTarget *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pbVar2;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  char *value;
  ostream *poVar5;
  pointer ppcVar6;
  bool bVar7;
  pair<bool,_const_char_*> pVar8;
  string report;
  string reportEntry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  ostringstream e;
  char *local_2a0;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *local_248;
  char *local_240 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  char *local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  local_1e8 = defaultValue;
  local_2a0 = cmGeneratorTarget::GetProperty(tgt,p);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1e0,tgt);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_1e0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_1e0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar7 = _Var4._M_current !=
          local_1e0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  if (bVar3 && _Var4._M_current !=
               local_1e0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xf5e,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  local_248 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((local_248->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (local_248->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_270," * Target \"",(allocator *)&local_1a8);
    std::__cxx11::string::append((string *)&local_270);
    if (_Var4._M_current !=
        local_1e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&local_270);
      valueAsString<char_const*>((string *)&local_1a8,local_2a0);
      std::__cxx11::string::append((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    std::__cxx11::string::append((char *)&local_270);
    std::operator+(&local_1c8,"INTERFACE_",p);
    local_250 = _Var4._M_current;
    for (ppcVar6 = (local_248->
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppcVar6 !=
        (local_248->
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
      this = *ppcVar6;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_200,this);
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_200.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_200.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_1c8);
      pbVar2 = local_200.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      value = cmGeneratorTarget::GetProperty(this,&local_1c8);
      local_220._M_string_length = 0;
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      local_220.field_2._M_local_buf[0] = '\0';
      if (_Var4._M_current == pbVar2) {
        value = local_2a0;
        if (bVar3) {
          value = "";
        }
        if (local_250 !=
            local_1e0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          value = local_2a0;
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_220);
        pbVar1 = local_250;
        std::__cxx11::string::append((string *)&local_220);
        std::__cxx11::string::append((char *)&local_220);
        valueAsString<char_const*>((string *)&local_1a8,value);
        std::__cxx11::string::append((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::append((char *)&local_220);
        if (pbVar1 == local_1e0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          if (bVar3) {
            pVar8 = consistentProperty<char_const*>("",value,t);
            std::__cxx11::string::append((string *)&local_270);
            compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,pVar8.second != "");
            std::__cxx11::string::append((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_1a8);
            value = pVar8.second;
            if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              poVar5 = std::operator<<(&local_1a8,"Property ");
              local_2a0 = "";
              poVar5 = std::operator<<(poVar5,(string *)p);
              poVar5 = std::operator<<(poVar5," on target \"");
              poVar5 = std::operator<<(poVar5,(string *)&tgt->Target->Name);
              poVar5 = std::operator<<(poVar5,"\" is\nimplied to be ");
              poVar5 = std::operator<<(poVar5,local_1e8);
              poVar5 = std::operator<<(poVar5,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar5 = std::operator<<(poVar5,(string *)p);
              poVar5 = std::operator<<(poVar5," property on\ndependency \"");
              poVar5 = std::operator<<(poVar5,(string *)&this->Target->Name);
              std::operator<<(poVar5,"\" is in conflict.\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(local_240[0],(char *)0x0,(char *)0x0,(char *)0x0);
              goto LAB_00468231;
            }
          }
          else {
            if (bVar7) {
              pVar8 = consistentProperty<char_const*>(local_2a0,value,t);
              value = pVar8.second;
              std::__cxx11::string::append((string *)&local_270);
              compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,local_2a0 != value);
              std::__cxx11::string::append((string *)&local_270);
              std::__cxx11::string::~string((string *)&local_1a8);
              if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                poVar5 = std::operator<<(&local_1a8,"The INTERFACE_");
                poVar5 = std::operator<<(poVar5,(string *)p);
                poVar5 = std::operator<<(poVar5," property of \"");
                poVar5 = std::operator<<(poVar5,(string *)&this->Target->Name);
                poVar5 = std::operator<<(poVar5,"\" does\nnot agree with the value of ");
                poVar5 = std::operator<<(poVar5,(string *)p);
                poVar5 = std::operator<<(poVar5," already determined\nfor \"");
                poVar5 = std::operator<<(poVar5,(string *)&tgt->Target->Name);
                std::operator<<(poVar5,"\".\n");
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(local_240[0],(char *)0x0,(char *)0x0,(char *)0x0);
                goto LAB_00468231;
              }
            }
            else {
              std::operator+((string *)&local_1a8,&local_220,"(Interface set)\n");
              std::__cxx11::string::append((string *)&local_270);
              std::__cxx11::string::~string((string *)&local_1a8);
            }
            bVar7 = true;
          }
        }
        else {
          pVar8 = consistentProperty<char_const*>(local_2a0,value,t);
          std::__cxx11::string::append((string *)&local_270);
          compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,local_2a0 != pVar8.second);
          std::__cxx11::string::append((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_1a8);
          value = pVar8.second;
          if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            poVar5 = std::operator<<(&local_1a8,"Property ");
            poVar5 = std::operator<<(poVar5,(string *)p);
            poVar5 = std::operator<<(poVar5," on target \"");
            poVar5 = std::operator<<(poVar5,(string *)&tgt->Target->Name);
            poVar5 = std::operator<<(poVar5,"\" does\nnot match the INTERFACE_");
            poVar5 = std::operator<<(poVar5,(string *)p);
            poVar5 = std::operator<<(poVar5," property requirement\nof dependency \"");
            poVar5 = std::operator<<(poVar5,(string *)&this->Target->Name);
            std::operator<<(poVar5,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(local_240[0],(char *)0x0,(char *)0x0,(char *)0x0);
LAB_00468231:
            std::__cxx11::string::~string((string *)local_240);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_220);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_200);
            break;
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_220);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_200);
      local_2a0 = value;
    }
    valueAsString<char_const*>((string *)&local_1a8,local_2a0);
    compatibilityType_abi_cxx11_(&local_220,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,(string *)&local_1a8,&local_270,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0);
  return local_2a0;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  for (std::vector<cmGeneratorTarget const*>::const_iterator li = deps.begin();
       li != deps.end(); ++li) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmGeneratorTarget const* theTarget = *li;

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent =
      getTypedProperty<PropertyType>(theTarget, interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p << " property requirement\nof "
                    "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}